

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O3

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateDotLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  string *psVar3;
  pointer pcVar4;
  NeuralNetworkSpecValidator *pNVar5;
  bool bVar6;
  LogMessage *pLVar7;
  iterator iVar8;
  Type *pTVar9;
  mapped_type_conflict1 *pmVar10;
  long *plVar11;
  size_type *psVar12;
  _Rb_tree_header *p_Var13;
  string err;
  pointer local_118;
  _Alloc_hider local_110;
  size_type local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  undefined1 local_f0 [8];
  _Alloc_hider local_e8;
  undefined1 local_e0 [40];
  string local_b8;
  NeuralNetworkSpecValidator *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  Result::Result((Result *)&local_118);
  validateInputCount((Result *)local_f0,layer,2,2);
  local_118 = (pointer)local_f0;
  std::__cxx11::string::operator=((string *)&local_110,(string *)&local_e8);
  pcVar4 = local_e0 + 8;
  if (local_e8._M_p != pcVar4) {
    operator_delete(local_e8._M_p,local_e0._8_8_ + 1);
  }
  bVar6 = Result::good((Result *)&local_118);
  if (bVar6) {
    validateOutputCount((Result *)local_f0,layer,1,1);
    local_118 = (pointer)local_f0;
    std::__cxx11::string::operator=((string *)&local_110,(string *)&local_e8);
    if (local_e8._M_p != pcVar4) {
      operator_delete(local_e8._M_p,local_e0._8_8_ + 1);
    }
  }
  bVar6 = Result::good((Result *)&local_118);
  if ((bVar6) && (this->ndArrayInterpretation == true)) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"DotProduct","");
    this_00 = &this->blobNameToRank;
    local_98 = this;
    validateInputOutputRankEquality((Result *)local_f0,layer,&local_70,this_00);
    local_118 = (pointer)local_f0;
    std::__cxx11::string::operator=((string *)&local_110,(string *)&local_e8);
    if (local_e8._M_p != pcVar4) {
      operator_delete(local_e8._M_p,local_e0._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    bVar6 = Result::good((Result *)&local_118);
    if (bVar6) {
      paVar1 = &local_b8.field_2;
      local_b8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"DotProduct","");
      validateRankCount((Result *)local_f0,layer,&local_b8,3,-1,this_00);
      local_118 = (pointer)local_f0;
      std::__cxx11::string::operator=((string *)&local_110,(string *)&local_e8);
      if (local_e8._M_p != pcVar4) {
        operator_delete(local_e8._M_p,local_e0._8_8_ + 1);
      }
      pNVar5 = local_98;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != paVar1) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      bVar6 = Result::good((Result *)&local_118);
      if (bVar6) {
        if ((layer->input_).super_RepeatedPtrFieldBase.current_size_ < 1) {
          google::protobuf::internal::LogMessage::LogMessage
                    ((LogMessage *)local_f0,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                     ,0x5ca);
          pLVar7 = google::protobuf::internal::LogMessage::operator<<
                             ((LogMessage *)local_f0,"CHECK failed: (index) < (current_size_): ");
          google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_b8,pLVar7);
          google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_f0);
        }
        iVar8 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ::find(&this_00->_M_t,
                       (key_type *)((layer->input_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
        p_Var13 = &(pNVar5->blobNameToRank)._M_t._M_impl.super__Rb_tree_header;
        if ((_Rb_tree_header *)iVar8._M_node != p_Var13) {
          if ((layer->input_).super_RepeatedPtrFieldBase.current_size_ < 2) {
            google::protobuf::internal::LogMessage::LogMessage
                      ((LogMessage *)local_f0,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                       ,0x5ca);
            pLVar7 = google::protobuf::internal::LogMessage::operator<<
                               ((LogMessage *)local_f0,"CHECK failed: (index) < (current_size_): ");
            google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_b8,pLVar7);
            google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_f0);
          }
          iVar8 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  ::find(&this_00->_M_t,
                         *(key_type **)((layer->input_).super_RepeatedPtrFieldBase.rep_ + 1));
          if ((_Rb_tree_header *)iVar8._M_node != p_Var13) {
            pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
                     Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                               (&(layer->input_).super_RepeatedPtrFieldBase,0);
            pmVar10 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      ::at(this_00,pTVar9);
            iVar2 = *pmVar10;
            pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
                     Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                               (&(layer->input_).super_RepeatedPtrFieldBase,1);
            pmVar10 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      ::at(this_00,pTVar9);
            if (iVar2 != *pmVar10) {
              local_e8._M_p = (pointer)0x0;
              local_e0[0] = '\0';
              psVar3 = (layer->name_).ptr_;
              pcVar4 = (psVar3->_M_dataplus)._M_p;
              local_f0 = (undefined1  [8])local_e0;
              local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_90,pcVar4,pcVar4 + psVar3->_M_string_length);
              std::operator+(&local_50,"Layer \'",&local_90);
              plVar11 = (long *)std::__cxx11::string::append((char *)&local_50);
              psVar12 = (size_type *)(plVar11 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar11 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar12) {
                local_b8.field_2._M_allocated_capacity = *psVar12;
                local_b8.field_2._8_8_ = plVar11[3];
                local_b8._M_dataplus._M_p = (pointer)paVar1;
              }
              else {
                local_b8.field_2._M_allocated_capacity = *psVar12;
                local_b8._M_dataplus._M_p = (pointer)*plVar11;
              }
              local_b8._M_string_length = plVar11[1];
              *plVar11 = (long)psVar12;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              std::__cxx11::string::operator=((string *)local_f0,(string *)&local_b8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8._M_dataplus._M_p != paVar1) {
                operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_50._M_dataplus._M_p != &local_50.field_2) {
                operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_90._M_dataplus._M_p != &local_90.field_2) {
                operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1
                               );
              }
              Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_f0);
              if (local_f0 != (undefined1  [8])local_e0) {
                operator_delete((void *)local_f0,CONCAT71(local_e0._1_7_,local_e0[0]) + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_110._M_p == &local_100) {
                return __return_storage_ptr__;
              }
              operator_delete(local_110._M_p,local_100._M_allocated_capacity + 1);
              return __return_storage_ptr__;
            }
          }
        }
      }
    }
  }
  *(pointer *)__return_storage_ptr__ = local_118;
  paVar1 = &(__return_storage_ptr__->m_message).field_2;
  (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_p == &local_100) {
    paVar1->_M_allocated_capacity = local_100._M_allocated_capacity;
    *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_100._8_8_;
  }
  else {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_110._M_p;
    (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
         local_100._M_allocated_capacity;
  }
  (__return_storage_ptr__->m_message)._M_string_length = local_108;
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateDotLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    // 2 inputs, 1 output
    r = validateInputCount(layer, 2, 2);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }

    if (!r.good()){ return r;}
    if (ndArrayInterpretation) {
        r = validateInputOutputRankEquality(layer, "DotProduct", blobNameToRank);
        if (!r.good()) {return r;}
        r = validateRankCount(layer, "DotProduct", 3, -1, blobNameToRank);
        if (!r.good()) {return r;}

        if (blobNameToRank.find(layer.input(0)) != blobNameToRank.end() &&
            blobNameToRank.find(layer.input(1)) != blobNameToRank.end()) {
            if (blobNameToRank.at(layer.input(0)) != blobNameToRank.at(layer.input(1))) {
                std::string err;
                err = "Layer '" + std::string(layer.name()) + "' of type 'DotProduct' expects equal ranks for its inputs, but they are not equal.";
                return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
            }
        }
    }

    return r;
}